

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall Centaurus::NFA<char>::add_state(NFA<char> *this,CharClass<char> *cc)

{
  pointer *ppNVar1;
  pointer pNVar2;
  iterator __position;
  
  pNVar2 = (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  NFABaseState<char,_int>::add_transition
            (pNVar2 + -1,cc,
             (int)((ulong)((long)pNVar2 -
                          (long)(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
                                super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,false
            );
  __position._M_current =
       (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
       super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current !=
      (this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
      super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    (__position._M_current)->_vptr_NFABaseState = (_func_int **)&PTR__NFABaseState_0019e280;
    ((__position._M_current)->m_transitions).
    super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((__position._M_current)->m_transitions).
    super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((__position._M_current)->m_transitions).
    super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppNVar1 = &(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states.
               super__Vector_base<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
    return;
  }
  std::
  vector<Centaurus::NFABaseState<char,_int>,_std::allocator<Centaurus::NFABaseState<char,_int>_>_>::
  _M_realloc_insert<>(&(this->super_NFABase<Centaurus::NFABaseState<char,_int>_>).m_states,
                      __position);
  return;
}

Assistant:

void add_state(const CharClass<TCHAR>& cc)
    {
        m_states.back().add_transition(cc, m_states.size());
        m_states.emplace_back();
    }